

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<kj::AppendableFile,_std::nullptr_t> __thiscall kj::newDiskAppendableFile(kj *this,OwnFd *fd)

{
  int iVar1;
  undefined8 *puVar2;
  Own<kj::AppendableFile,_std::nullptr_t> OVar3;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  iVar1 = fd->fd;
  *(int *)(puVar2 + 2) = iVar1;
  fd->fd = -1;
  *(int *)(puVar2 + 4) = iVar1;
  *(undefined4 *)((long)puVar2 + 0x24) = 0xffffffff;
  *puVar2 = &PTR_getFd_00262478;
  puVar2[1] = &DAT_002624d8;
  puVar2[3] = &DAT_00262508;
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile>::instance;
  *(undefined8 **)(this + 8) = puVar2;
  OVar3.ptr = (AppendableFile *)0xffffffff;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<AppendableFile> newDiskAppendableFile(kj::OwnFd fd) {
  return heap<DiskAppendableFile>(kj::mv(fd));
}